

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::ImDrawList(ImDrawList *this,ImDrawListSharedData *shared_data)

{
  ImDrawCmd *in_RSI;
  ImVector<ImDrawCmd> *in_RDI;
  ImDrawList *this_00;
  
  ImVector<ImDrawCmd>::ImVector(in_RDI);
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)(in_RDI + 1));
  ImVector<ImDrawVert>::ImVector((ImVector<ImDrawVert> *)(in_RDI + 2));
  ImVector<ImVec4>::ImVector((ImVector<ImVec4> *)(in_RDI + 6));
  ImVector<void_*>::ImVector((ImVector<void_*> *)(in_RDI + 7));
  ImVector<ImVec2>::ImVector((ImVector<ImVec2> *)(in_RDI + 8));
  this_00 = (ImDrawList *)&in_RDI[9].Data;
  ImVector<ImDrawChannel>::ImVector((ImVector<ImDrawChannel> *)this_00);
  in_RDI[3].Data = in_RSI;
  in_RDI[4].Size = 0;
  in_RDI[4].Capacity = 0;
  Clear(this_00);
  return;
}

Assistant:

ImDrawList(const ImDrawListSharedData* shared_data) { _Data = shared_data; _OwnerName = NULL; Clear(); }